

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_6_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined4 uVar29;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  short sVar40;
  undefined1 auVar32 [16];
  short sVar35;
  short sVar41;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  short sVar42;
  short sVar48;
  short sVar49;
  short sVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar64;
  short sVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ushort uVar68;
  short sVar69;
  ushort uVar72;
  short sVar73;
  ushort uVar74;
  short sVar75;
  ushort uVar76;
  short sVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar70 [16];
  ushort uVar81;
  undefined1 auVar71 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  __m128i d5;
  __m128i x0;
  __m128i x1;
  __m128i x2;
  __m128i x3;
  __m128i d7;
  __m128i d6;
  __m128i d4;
  longlong local_128 [2];
  longlong local_118 [2];
  longlong local_108 [2];
  longlong local_f8 [2];
  __m128i abs_p1p0;
  __m128i local_d8;
  __m128i local_c8;
  __m128i hev;
  __m128i mask;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i pq [3];
  
  x3[0] = *(longlong *)(s + -3);
  x3[1] = *(longlong *)(s + 1);
  x2[0] = *(longlong *)(s + (long)p + -3);
  x2[1] = *(longlong *)(s + (long)p + -3 + 4);
  x1[0] = *(longlong *)(s + (long)(p * 2) + -3);
  x1[1] = *(longlong *)(s + (long)(p * 2) + -3 + 4);
  x0[0] = *(longlong *)(s + (long)(p * 3) + -3);
  x0[1] = *(longlong *)(s + (long)(p * 3) + -3 + 4);
  highbd_transpose4x8_8x4_sse2
            (&x3,&x2,&x1,&x0,&local_f8,&local_108,&local_118,&local_128,&d4,&d5,&d6,&d7);
  pq[0][0] = local_118[0];
  pq[0][1] = local_128[0];
  pq[1][0] = local_108[0];
  pq[1][1] = d4[0];
  pq[2][0] = local_f8[0];
  pq[2][1] = d5[0];
  auVar30 = *(undefined1 (*) [16])blimit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar30._0_13_;
  auVar3[0xe] = auVar30[7];
  auVar6[0xc] = auVar30[6];
  auVar6._0_12_ = auVar30._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar30._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar30[5];
  auVar12._0_10_ = auVar30._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar30._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar30[4];
  auVar18._0_8_ = auVar30._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar20._7_8_ = 0;
  auVar20._0_7_ = auVar18._8_7_;
  auVar23._1_8_ = SUB158(auVar20 << 0x40,7);
  auVar23[0] = auVar30[3];
  auVar23._9_6_ = 0;
  auVar24._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar24[0] = auVar30[2];
  auVar24._11_4_ = 0;
  auVar31._3_12_ = SUB1512(auVar24 << 0x20,3);
  auVar31[2] = auVar30[1];
  auVar31[0] = auVar30[0];
  auVar31[1] = 0;
  auVar31[0xf] = 0;
  auVar51 = ZEXT416(bd - 8);
  blimit_1 = (__m128i)psllw(auVar31,auVar51);
  auVar30 = *(undefined1 (*) [16])limit;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar30._0_13_;
  auVar1[0xe] = auVar30[7];
  auVar4[0xc] = auVar30[6];
  auVar4._0_12_ = auVar30._0_12_;
  auVar4._13_2_ = auVar1._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar30._0_11_;
  auVar7._12_3_ = auVar4._12_3_;
  auVar10[10] = auVar30[5];
  auVar10._0_10_ = auVar30._0_10_;
  auVar10._11_4_ = auVar7._11_4_;
  auVar13[9] = 0;
  auVar13._0_9_ = auVar30._0_9_;
  auVar13._10_5_ = auVar10._10_5_;
  auVar16[8] = auVar30[4];
  auVar16._0_8_ = auVar30._0_8_;
  auVar16._9_6_ = auVar13._9_6_;
  auVar21._7_8_ = 0;
  auVar21._0_7_ = auVar16._8_7_;
  auVar25._1_8_ = SUB158(auVar21 << 0x40,7);
  auVar25[0] = auVar30[3];
  auVar25._9_6_ = 0;
  auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
  auVar26[0] = auVar30[2];
  auVar26._11_4_ = 0;
  auVar19[2] = auVar30[1];
  auVar19._0_2_ = auVar30._0_2_;
  auVar19._3_12_ = SUB1512(auVar26 << 0x20,3);
  auVar70._0_2_ = auVar30._0_2_ & 0xff;
  auVar70._2_13_ = auVar19._2_13_;
  auVar70[0xf] = 0;
  limit_1 = (__m128i)psllw(auVar70,auVar51);
  auVar30 = *(undefined1 (*) [16])thresh;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar30._0_13_;
  auVar2[0xe] = auVar30[7];
  auVar5[0xc] = auVar30[6];
  auVar5._0_12_ = auVar30._0_12_;
  auVar5._13_2_ = auVar2._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar30._0_11_;
  auVar8._12_3_ = auVar5._12_3_;
  auVar11[10] = auVar30[5];
  auVar11._0_10_ = auVar30._0_10_;
  auVar11._11_4_ = auVar8._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar30._0_9_;
  auVar14._10_5_ = auVar11._10_5_;
  auVar17[8] = auVar30[4];
  auVar17._0_8_ = auVar30._0_8_;
  auVar17._9_6_ = auVar14._9_6_;
  auVar22._7_8_ = 0;
  auVar22._0_7_ = auVar17._8_7_;
  auVar27._1_8_ = SUB158(auVar22 << 0x40,7);
  auVar27[0] = auVar30[3];
  auVar27._9_6_ = 0;
  auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
  auVar28[0] = auVar30[2];
  auVar28._11_4_ = 0;
  auVar82._3_12_ = SUB1512(auVar28 << 0x20,3);
  auVar82[2] = auVar30[1];
  auVar82[0] = auVar30[0];
  auVar82[1] = 0;
  auVar82[0xf] = 0;
  thresh_1 = (__m128i)psllw(auVar82,auVar51);
  auVar30 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar30 = pshuflw(auVar30,auVar30,0);
  uVar29 = auVar30._0_4_;
  highbd_hev_filter_mask_x_sse2
            (pq,3,&local_c8,&local_d8,&abs_p1p0,&limit_1,&blimit_1,&thresh_1,&hev,&mask);
  auVar30 = psllw(_DAT_0046feb0,ZEXT416((uint)bd));
  auVar43._8_4_ = 0xffffffff;
  auVar43._0_8_ = 0xffffffffffffffff;
  auVar43._12_4_ = 0xffffffff;
  auVar52 = paddsw(auVar30,auVar43);
  auVar30._4_4_ = uVar29;
  auVar30._0_4_ = uVar29;
  auVar30._8_4_ = uVar29;
  auVar30._12_4_ = uVar29;
  auVar52 = psubsw(auVar52,auVar30);
  auVar66 = psubsw((undefined1  [16])0x0,auVar30);
  auVar82 = psubsw((undefined1  [16])local_c8,auVar30);
  auVar31 = psubsw((undefined1  [16])local_d8,auVar30);
  auVar70 = psubsw(auVar82,auVar31);
  sVar49 = auVar52._0_2_;
  sVar35 = auVar70._0_2_;
  uVar68 = (ushort)(sVar49 < sVar35) * sVar49 | (ushort)(sVar49 >= sVar35) * sVar35;
  sVar50 = auVar52._2_2_;
  sVar35 = auVar70._2_2_;
  uVar72 = (ushort)(sVar50 < sVar35) * sVar50 | (ushort)(sVar50 >= sVar35) * sVar35;
  sVar56 = auVar52._4_2_;
  sVar35 = auVar70._4_2_;
  uVar74 = (ushort)(sVar56 < sVar35) * sVar56 | (ushort)(sVar56 >= sVar35) * sVar35;
  sVar57 = auVar52._6_2_;
  sVar35 = auVar70._6_2_;
  uVar76 = (ushort)(sVar57 < sVar35) * sVar57 | (ushort)(sVar57 >= sVar35) * sVar35;
  sVar58 = auVar52._8_2_;
  sVar35 = auVar70._8_2_;
  uVar78 = (ushort)(sVar58 < sVar35) * sVar58 | (ushort)(sVar58 >= sVar35) * sVar35;
  sVar59 = auVar52._10_2_;
  sVar35 = auVar70._10_2_;
  uVar79 = (ushort)(sVar59 < sVar35) * sVar59 | (ushort)(sVar59 >= sVar35) * sVar35;
  sVar60 = auVar52._12_2_;
  sVar35 = auVar70._12_2_;
  sVar36 = auVar70._14_2_;
  uVar80 = (ushort)(sVar60 < sVar35) * sVar60 | (ushort)(sVar60 >= sVar35) * sVar35;
  sVar61 = auVar52._14_2_;
  uVar81 = (ushort)(sVar61 < sVar36) * sVar61 | (ushort)(sVar61 >= sVar36) * sVar36;
  sVar35 = auVar66._0_2_;
  auVar71._0_2_ = (ushort)((short)uVar68 < sVar35) * sVar35 | ((short)uVar68 >= sVar35) * uVar68;
  sVar36 = auVar66._2_2_;
  auVar71._2_2_ = (ushort)((short)uVar72 < sVar36) * sVar36 | ((short)uVar72 >= sVar36) * uVar72;
  sVar37 = auVar66._4_2_;
  auVar71._4_2_ = (ushort)((short)uVar74 < sVar37) * sVar37 | ((short)uVar74 >= sVar37) * uVar74;
  sVar38 = auVar66._6_2_;
  auVar71._6_2_ = (ushort)((short)uVar76 < sVar38) * sVar38 | ((short)uVar76 >= sVar38) * uVar76;
  sVar39 = auVar66._8_2_;
  auVar71._8_2_ = (ushort)((short)uVar78 < sVar39) * sVar39 | ((short)uVar78 >= sVar39) * uVar78;
  sVar41 = auVar66._10_2_;
  auVar71._10_2_ = (ushort)((short)uVar79 < sVar41) * sVar41 | ((short)uVar79 >= sVar41) * uVar79;
  sVar42 = auVar66._12_2_;
  auVar71._12_2_ = (ushort)((short)uVar80 < sVar42) * sVar42 | ((short)uVar80 >= sVar42) * uVar80;
  sVar48 = auVar66._14_2_;
  auVar71._14_2_ = (ushort)((short)uVar81 < sVar48) * sVar48 | ((short)uVar81 >= sVar48) * uVar81;
  auVar52 = psubsw(auVar71 >> 0x40 & (undefined1  [16])hev,auVar71);
  auVar52 = psubsw(auVar52,auVar71);
  auVar52 = psubsw(auVar52,auVar71);
  sVar62 = auVar52._0_2_;
  uVar68 = (ushort)(sVar49 < sVar62) * sVar49 | (ushort)(sVar49 >= sVar62) * sVar62;
  sVar62 = auVar52._2_2_;
  uVar72 = (ushort)(sVar50 < sVar62) * sVar50 | (ushort)(sVar50 >= sVar62) * sVar62;
  sVar62 = auVar52._4_2_;
  uVar74 = (ushort)(sVar56 < sVar62) * sVar56 | (ushort)(sVar56 >= sVar62) * sVar62;
  sVar62 = auVar52._6_2_;
  uVar76 = (ushort)(sVar57 < sVar62) * sVar57 | (ushort)(sVar57 >= sVar62) * sVar62;
  sVar62 = auVar52._8_2_;
  uVar78 = (ushort)(sVar58 < sVar62) * sVar58 | (ushort)(sVar58 >= sVar62) * sVar62;
  sVar62 = auVar52._10_2_;
  uVar79 = (ushort)(sVar59 < sVar62) * sVar59 | (ushort)(sVar59 >= sVar62) * sVar62;
  sVar62 = auVar52._12_2_;
  sVar40 = auVar52._14_2_;
  uVar80 = (ushort)(sVar60 < sVar62) * sVar60 | (ushort)(sVar60 >= sVar62) * sVar62;
  uVar81 = (ushort)(sVar61 < sVar40) * sVar61 | (ushort)(sVar61 >= sVar40) * sVar40;
  auVar83._0_2_ = (ushort)((short)uVar68 < sVar35) * sVar35 | ((short)uVar68 >= sVar35) * uVar68;
  auVar83._2_2_ = (ushort)((short)uVar72 < sVar36) * sVar36 | ((short)uVar72 >= sVar36) * uVar72;
  auVar83._4_2_ = (ushort)((short)uVar74 < sVar37) * sVar37 | ((short)uVar74 >= sVar37) * uVar74;
  auVar83._6_2_ = (ushort)((short)uVar76 < sVar38) * sVar38 | ((short)uVar76 >= sVar38) * uVar76;
  auVar83._8_2_ = (ushort)((short)uVar78 < sVar39) * sVar39 | ((short)uVar78 >= sVar39) * uVar78;
  auVar83._10_2_ = (ushort)((short)uVar79 < sVar41) * sVar41 | ((short)uVar79 >= sVar41) * uVar79;
  auVar83._12_2_ = (ushort)((short)uVar80 < sVar42) * sVar42 | ((short)uVar80 >= sVar42) * uVar80;
  auVar83._14_2_ = (ushort)((short)uVar81 < sVar48) * sVar48 | ((short)uVar81 >= sVar48) * uVar81;
  auVar83 = auVar83 & (undefined1  [16])mask;
  auVar84._0_8_ = auVar83._0_8_;
  auVar84._8_4_ = auVar83._0_4_;
  auVar84._12_4_ = auVar83._4_4_;
  auVar52 = paddsw(auVar84,_DAT_0046fec0);
  sVar62 = auVar52._0_2_;
  uVar68 = (ushort)(sVar49 < sVar62) * sVar49 | (ushort)(sVar49 >= sVar62) * sVar62;
  sVar62 = auVar52._2_2_;
  uVar72 = (ushort)(sVar50 < sVar62) * sVar50 | (ushort)(sVar50 >= sVar62) * sVar62;
  sVar62 = auVar52._4_2_;
  uVar74 = (ushort)(sVar56 < sVar62) * sVar56 | (ushort)(sVar56 >= sVar62) * sVar62;
  sVar62 = auVar52._6_2_;
  uVar76 = (ushort)(sVar57 < sVar62) * sVar57 | (ushort)(sVar57 >= sVar62) * sVar62;
  sVar62 = auVar52._8_2_;
  uVar78 = (ushort)(sVar58 < sVar62) * sVar58 | (ushort)(sVar58 >= sVar62) * sVar62;
  sVar62 = auVar52._10_2_;
  uVar79 = (ushort)(sVar59 < sVar62) * sVar59 | (ushort)(sVar59 >= sVar62) * sVar62;
  sVar62 = auVar52._12_2_;
  sVar40 = auVar52._14_2_;
  uVar80 = (ushort)(sVar60 < sVar62) * sVar60 | (ushort)(sVar60 >= sVar62) * sVar62;
  uVar81 = (ushort)(sVar61 < sVar40) * sVar61 | (ushort)(sVar61 >= sVar40) * sVar40;
  auVar85._0_2_ = (ushort)((short)uVar68 < sVar35) * sVar35 | ((short)uVar68 >= sVar35) * uVar68;
  auVar85._2_2_ = (ushort)((short)uVar72 < sVar36) * sVar36 | ((short)uVar72 >= sVar36) * uVar72;
  auVar85._4_2_ = (ushort)((short)uVar74 < sVar37) * sVar37 | ((short)uVar74 >= sVar37) * uVar74;
  auVar85._6_2_ = (ushort)((short)uVar76 < sVar38) * sVar38 | ((short)uVar76 >= sVar38) * uVar76;
  auVar85._8_2_ = (ushort)((short)uVar78 < sVar39) * sVar39 | ((short)uVar78 >= sVar39) * uVar78;
  auVar85._10_2_ = (ushort)((short)uVar79 < sVar41) * sVar41 | ((short)uVar79 >= sVar41) * uVar79;
  auVar85._12_2_ = (ushort)((short)uVar80 < sVar42) * sVar42 | ((short)uVar80 >= sVar42) * uVar80;
  auVar85._14_2_ = (ushort)((short)uVar81 < sVar48) * sVar48 | ((short)uVar81 >= sVar48) * uVar81;
  auVar66 = psraw(auVar85,3);
  auVar87._0_2_ = auVar66._0_2_ + 1;
  auVar87._2_2_ = auVar66._2_2_ + 1;
  auVar87._4_2_ = auVar66._4_2_ + 1;
  auVar87._6_2_ = auVar66._6_2_ + 1;
  auVar87._8_2_ = auVar66._0_2_ + 1;
  auVar87._10_2_ = auVar66._2_2_ + 1;
  auVar87._12_2_ = auVar66._4_2_ + 1;
  auVar87._14_2_ = auVar66._6_2_ + 1;
  auVar70 = psraw(auVar87,1);
  auVar52._8_8_ = d5[0];
  auVar52._0_8_ = local_f8[0];
  auVar44._8_8_ = SUB168(~(undefined1  [16])hev & auVar70,8);
  auVar44._0_8_ = auVar66._8_8_;
  auVar86._8_8_ = SUB168(~(undefined1  [16])hev & auVar70,0);
  auVar86._0_8_ = auVar66._0_8_;
  auVar66._8_8_ = local_128[0];
  auVar66._0_8_ = local_118[0];
  auVar31 = psubsw(auVar31,auVar86);
  auVar70 = paddsw(auVar44,auVar82);
  sVar62 = auVar31._0_2_;
  uVar68 = (ushort)(sVar49 < sVar62) * sVar49 | (ushort)(sVar49 >= sVar62) * sVar62;
  sVar62 = auVar31._2_2_;
  uVar72 = (ushort)(sVar50 < sVar62) * sVar50 | (ushort)(sVar50 >= sVar62) * sVar62;
  sVar62 = auVar31._4_2_;
  uVar74 = (ushort)(sVar56 < sVar62) * sVar56 | (ushort)(sVar56 >= sVar62) * sVar62;
  sVar62 = auVar31._6_2_;
  uVar76 = (ushort)(sVar57 < sVar62) * sVar57 | (ushort)(sVar57 >= sVar62) * sVar62;
  sVar62 = auVar31._8_2_;
  uVar78 = (ushort)(sVar58 < sVar62) * sVar58 | (ushort)(sVar58 >= sVar62) * sVar62;
  sVar62 = auVar31._10_2_;
  uVar79 = (ushort)(sVar59 < sVar62) * sVar59 | (ushort)(sVar59 >= sVar62) * sVar62;
  sVar62 = auVar31._12_2_;
  sVar40 = auVar31._14_2_;
  uVar80 = (ushort)(sVar60 < sVar62) * sVar60 | (ushort)(sVar60 >= sVar62) * sVar62;
  uVar81 = (ushort)(sVar61 < sVar40) * sVar61 | (ushort)(sVar61 >= sVar40) * sVar40;
  auVar32._0_2_ = (ushort)((short)uVar68 < sVar35) * sVar35 | ((short)uVar68 >= sVar35) * uVar68;
  auVar32._2_2_ = (ushort)((short)uVar72 < sVar36) * sVar36 | ((short)uVar72 >= sVar36) * uVar72;
  auVar32._4_2_ = (ushort)((short)uVar74 < sVar37) * sVar37 | ((short)uVar74 >= sVar37) * uVar74;
  auVar32._6_2_ = (ushort)((short)uVar76 < sVar38) * sVar38 | ((short)uVar76 >= sVar38) * uVar76;
  auVar32._8_2_ = (ushort)((short)uVar78 < sVar39) * sVar39 | ((short)uVar78 >= sVar39) * uVar78;
  auVar32._10_2_ = (ushort)((short)uVar79 < sVar41) * sVar41 | ((short)uVar79 >= sVar41) * uVar79;
  auVar32._12_2_ = (ushort)((short)uVar80 < sVar42) * sVar42 | ((short)uVar80 >= sVar42) * uVar80;
  auVar32._14_2_ = (ushort)((short)uVar81 < sVar48) * sVar48 | ((short)uVar81 >= sVar48) * uVar81;
  sVar62 = auVar70._0_2_;
  uVar68 = (ushort)(sVar49 < sVar62) * sVar49 | (ushort)(sVar49 >= sVar62) * sVar62;
  sVar49 = auVar70._2_2_;
  uVar72 = (ushort)(sVar50 < sVar49) * sVar50 | (ushort)(sVar50 >= sVar49) * sVar49;
  sVar49 = auVar70._4_2_;
  uVar74 = (ushort)(sVar56 < sVar49) * sVar56 | (ushort)(sVar56 >= sVar49) * sVar49;
  sVar49 = auVar70._6_2_;
  uVar76 = (ushort)(sVar57 < sVar49) * sVar57 | (ushort)(sVar57 >= sVar49) * sVar49;
  sVar49 = auVar70._8_2_;
  uVar78 = (ushort)(sVar58 < sVar49) * sVar58 | (ushort)(sVar58 >= sVar49) * sVar49;
  sVar49 = auVar70._10_2_;
  uVar79 = (ushort)(sVar59 < sVar49) * sVar59 | (ushort)(sVar59 >= sVar49) * sVar49;
  sVar49 = auVar70._12_2_;
  sVar50 = auVar70._14_2_;
  uVar80 = (ushort)(sVar60 < sVar49) * sVar60 | (ushort)(sVar60 >= sVar49) * sVar49;
  uVar81 = (ushort)(sVar61 < sVar50) * sVar61 | (ushort)(sVar61 >= sVar50) * sVar50;
  auVar45._0_2_ = (ushort)((short)uVar68 < sVar35) * sVar35 | ((short)uVar68 >= sVar35) * uVar68;
  auVar45._2_2_ = (ushort)((short)uVar72 < sVar36) * sVar36 | ((short)uVar72 >= sVar36) * uVar72;
  auVar45._4_2_ = (ushort)((short)uVar74 < sVar37) * sVar37 | ((short)uVar74 >= sVar37) * uVar74;
  auVar45._6_2_ = (ushort)((short)uVar76 < sVar38) * sVar38 | ((short)uVar76 >= sVar38) * uVar76;
  auVar45._8_2_ = (ushort)((short)uVar78 < sVar39) * sVar39 | ((short)uVar78 >= sVar39) * uVar78;
  auVar45._10_2_ = (ushort)((short)uVar79 < sVar41) * sVar41 | ((short)uVar79 >= sVar41) * uVar79;
  auVar45._12_2_ = (ushort)((short)uVar80 < sVar42) * sVar42 | ((short)uVar80 >= sVar42) * uVar80;
  auVar45._14_2_ = (ushort)((short)uVar81 < sVar48) * sVar48 | ((short)uVar81 >= sVar48) * uVar81;
  auVar31 = paddsw(auVar32,auVar30);
  auVar30 = paddsw(auVar45,auVar30);
  auVar70 = psubusw(auVar52,auVar66);
  auVar52 = psubusw(auVar66,auVar52);
  auVar52 = auVar52 | auVar70;
  sVar35 = auVar52._0_2_;
  uVar68 = (ushort)(sVar35 < (short)abs_p1p0[0]) * (short)abs_p1p0[0] |
           (ushort)(sVar35 >= (short)abs_p1p0[0]) * sVar35;
  sVar35 = auVar52._2_2_;
  uVar72 = (ushort)(sVar35 < abs_p1p0[0]._2_2_) * abs_p1p0[0]._2_2_ |
           (ushort)(sVar35 >= abs_p1p0[0]._2_2_) * sVar35;
  sVar35 = auVar52._4_2_;
  uVar74 = (ushort)(sVar35 < abs_p1p0[0]._4_2_) * abs_p1p0[0]._4_2_ |
           (ushort)(sVar35 >= abs_p1p0[0]._4_2_) * sVar35;
  sVar35 = auVar52._6_2_;
  uVar76 = (ushort)(sVar35 < abs_p1p0[0]._6_2_) * abs_p1p0[0]._6_2_ |
           (ushort)(sVar35 >= abs_p1p0[0]._6_2_) * sVar35;
  sVar35 = auVar52._8_2_;
  uVar78 = (ushort)(sVar35 < (short)abs_p1p0[1]) * (short)abs_p1p0[1] |
           (ushort)(sVar35 >= (short)abs_p1p0[1]) * sVar35;
  sVar35 = auVar52._10_2_;
  uVar79 = (ushort)(sVar35 < abs_p1p0[1]._2_2_) * abs_p1p0[1]._2_2_ |
           (ushort)(sVar35 >= abs_p1p0[1]._2_2_) * sVar35;
  sVar35 = auVar52._12_2_;
  sVar36 = auVar52._14_2_;
  uVar80 = (ushort)(sVar35 < abs_p1p0[1]._4_2_) * abs_p1p0[1]._4_2_ |
           (ushort)(sVar35 >= abs_p1p0[1]._4_2_) * sVar35;
  uVar81 = (ushort)(sVar36 < abs_p1p0[1]._6_2_) * abs_p1p0[1]._6_2_ |
           (ushort)(sVar36 >= abs_p1p0[1]._6_2_) * sVar36;
  auVar52 = psllw(_DAT_0046feb0,auVar51);
  auVar53._0_2_ =
       ((short)uVar78 < (short)uVar68) * uVar68 | ((short)uVar78 >= (short)uVar68) * uVar78;
  auVar53._2_2_ =
       ((short)uVar79 < (short)uVar72) * uVar72 | ((short)uVar79 >= (short)uVar72) * uVar79;
  auVar53._4_2_ =
       ((short)uVar80 < (short)uVar74) * uVar74 | ((short)uVar80 >= (short)uVar74) * uVar80;
  auVar53._6_2_ =
       ((short)uVar81 < (short)uVar76) * uVar76 | ((short)uVar81 >= (short)uVar76) * uVar81;
  auVar53._8_2_ = (0 < (short)uVar78) * uVar78;
  auVar53._10_2_ = (0 < (short)uVar79) * uVar79;
  auVar53._12_2_ = (0 < (short)uVar80) * uVar80;
  auVar53._14_2_ = (0 < (short)uVar81) * uVar81;
  auVar52 = psubusw(auVar53,auVar52);
  auVar54._0_2_ = -(ushort)(auVar52._0_2_ == 0);
  auVar54._2_2_ = -(ushort)(auVar52._2_2_ == 0);
  auVar54._4_2_ = -(ushort)(auVar52._4_2_ == 0);
  auVar54._6_2_ = -(ushort)(auVar52._6_2_ == 0);
  auVar54._8_2_ = -(ushort)(auVar52._8_2_ == 0);
  auVar54._10_2_ = -(ushort)(auVar52._10_2_ == 0);
  auVar54._12_2_ = -(ushort)(auVar52._12_2_ == 0);
  auVar54._14_2_ = -(ushort)(auVar52._14_2_ == 0);
  auVar55 = auVar54 & (undefined1  [16])mask;
  auVar51._0_8_ = auVar55._0_8_;
  auVar51._8_4_ = auVar55._0_4_;
  auVar51._12_4_ = auVar55._4_4_;
  auVar67._0_2_ = -(ushort)(auVar55._0_2_ == 0);
  auVar67._2_2_ = -(ushort)(auVar55._2_2_ == 0);
  auVar67._4_2_ = -(ushort)(auVar55._4_2_ == 0);
  auVar67._6_2_ = -(ushort)(auVar55._6_2_ == 0);
  auVar67._8_2_ = -(ushort)(auVar55._0_2_ == 0);
  auVar67._10_2_ = -(ushort)(auVar55._2_2_ == 0);
  auVar67._12_2_ = -(ushort)(auVar55._4_2_ == 0);
  auVar67._14_2_ = -(ushort)(auVar55._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) | (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar67._14_2_ >> 7) & 1) << 0xe | auVar67._14_2_ & 0x8000) != 0xffff
     ) {
    sVar56 = (short)((ulong)local_118[0] >> 0x10);
    sVar57 = (short)((ulong)local_118[0] >> 0x20);
    sVar58 = (short)((ulong)local_118[0] >> 0x30);
    sVar59 = (short)local_128[0];
    sVar61 = (short)((ulong)local_128[0] >> 0x10);
    sVar40 = (short)((ulong)local_128[0] >> 0x20);
    sVar64 = (short)((ulong)local_128[0] >> 0x30);
    local_1d8 = (short)local_108[0];
    sStack_1d6 = (short)((ulong)local_108[0] >> 0x10);
    sStack_1d4 = (short)((ulong)local_108[0] >> 0x20);
    sStack_1d2 = (short)((ulong)local_108[0] >> 0x30);
    sStack_1d0 = (short)d4[0];
    sStack_1ce = (short)((ulong)d4[0] >> 0x10);
    sStack_1cc = (short)((ulong)d4[0] >> 0x20);
    sStack_1ca = (short)((ulong)d4[0] >> 0x30);
    sVar60 = sVar59 * 2 + sStack_1d0;
    sVar62 = sVar61 * 2 + sStack_1ce;
    sVar63 = sVar40 * 2 + sStack_1cc;
    sVar65 = sVar64 * 2 + sStack_1ca;
    sVar35 = (short)((ulong)local_f8[0] >> 0x10);
    sVar36 = (short)((ulong)local_f8[0] >> 0x20);
    sVar37 = (short)((ulong)local_f8[0] >> 0x30);
    sVar38 = (short)((ulong)d5[0] >> 0x10);
    sVar39 = (short)((ulong)d5[0] >> 0x20);
    sVar41 = (short)((ulong)d5[0] >> 0x30);
    sVar69 = (short)local_118[0] * 2 + local_1d8 + 4;
    sVar73 = sVar56 * 2 + sStack_1d6 + 4;
    sVar75 = sVar57 * 2 + sStack_1d4 + 4;
    sVar77 = sVar58 * 2 + sStack_1d2 + 4;
    sVar42 = sVar69 + (short)local_f8[0] + local_1d8;
    sVar48 = sVar73 + sVar35 + sStack_1d6;
    sVar49 = sVar75 + sVar36 + sStack_1d4;
    sVar50 = sVar77 + sVar37 + sStack_1d2;
    auVar46._0_2_ = (ushort)(sVar42 + sVar60) >> 3;
    auVar46._2_2_ = (ushort)(sVar48 + sVar62) >> 3;
    auVar46._4_2_ = (ushort)(sVar49 + sVar63) >> 3;
    auVar46._6_2_ = (ushort)(sVar50 + sVar65) >> 3;
    auVar46._8_2_ = (ushort)((short)local_f8[0] * 2 + sVar59 + sVar42) >> 3;
    auVar46._10_2_ = (ushort)(sVar35 * 2 + sVar61 + sVar48) >> 3;
    auVar46._12_2_ = (ushort)(sVar36 * 2 + sVar40 + sVar49) >> 3;
    auVar46._14_2_ = (ushort)(sVar37 * 2 + sVar64 + sVar50) >> 3;
    uVar68 = (short)d5[0] + sStack_1d0 + sVar60 + sVar69;
    uVar72 = sVar38 + sStack_1ce + sVar62 + sVar73;
    uVar74 = sVar39 + sStack_1cc + sVar63 + sVar75;
    uVar76 = sVar41 + sStack_1ca + sVar65 + sVar77;
    sStack_1e0 = (short)d5[1];
    sStack_1de = (short)((ulong)d5[1] >> 0x10);
    sStack_1dc = (short)((ulong)d5[1] >> 0x20);
    sStack_1da = (short)((ulong)d5[1] >> 0x30);
    auVar55._0_2_ = ((short)d5[0] * 2 - (local_1d8 + (short)local_118[0])) + uVar68;
    auVar55._2_2_ = (sVar38 * 2 - (sStack_1d6 + sVar56)) + uVar72;
    auVar55._4_2_ = (sVar39 * 2 - (sStack_1d4 + sVar57)) + uVar74;
    auVar55._6_2_ = (sVar41 * 2 - (sStack_1d2 + sVar58)) + uVar76;
    auVar55._8_2_ = (sStack_1e0 * 2 - (sStack_1d0 + sVar59)) + sVar60 + 4;
    auVar55._10_2_ = (sStack_1de * 2 - (sStack_1ce + sVar61)) + sVar62 + 4;
    auVar55._12_2_ = (sStack_1dc * 2 - (sStack_1cc + sVar40)) + sVar63 + 4;
    auVar55._14_2_ = (sStack_1da * 2 - (sStack_1ca + sVar64)) + sVar65 + 4;
    auVar33._0_2_ = uVar68 >> 3;
    auVar33._2_2_ = uVar72 >> 3;
    auVar33._4_2_ = uVar74 >> 3;
    auVar33._6_2_ = uVar76 >> 3;
    auVar33._8_2_ = auVar55._0_2_ >> 3;
    auVar33._10_2_ = auVar55._2_2_ >> 3;
    auVar33._12_2_ = auVar55._4_2_ >> 3;
    auVar33._14_2_ = auVar55._6_2_ >> 3;
    auVar31 = auVar33 & auVar51 | ~auVar51 & auVar31;
    auVar30 = auVar46 & auVar51 | ~auVar51 & auVar30;
  }
  auVar47._0_4_ = auVar30._0_4_;
  auVar47._12_4_ = auVar30._12_4_;
  auVar47._4_4_ = auVar30._8_4_;
  auVar47._8_4_ = auVar30._4_4_;
  auVar66 = pshufhw(auVar51,auVar47,0x72);
  auVar52 = pshuflw(auVar47,auVar47,0x72);
  auVar34._0_4_ = auVar31._0_4_;
  auVar34._12_4_ = auVar31._12_4_;
  auVar34._4_4_ = auVar31._8_4_;
  auVar34._8_4_ = auVar31._4_4_;
  auVar31 = pshufhw(auVar55,auVar34,0xd8);
  auVar30 = pshuflw(auVar34,auVar34,0xd8);
  *(ulong *)(s + -2) = CONCAT44(auVar30._0_4_,auVar52._0_4_);
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar30._4_4_,auVar52._4_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar31._8_4_,auVar66._8_4_);
  *(ulong *)(s + (long)(p * 3) + -2) = CONCAT44(auVar31._12_4_,auVar66._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x3, x2, x1, x0, p0, q0;
  __m128i p1p0, q1q0;

  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&x3, &x2, &x1, &x0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  highbd_lpf_internal_6_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &p1p0, &q1q0, blimit,
                             limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose4x8_8x4_low_sse2(&p0, &p1p0, &q1q0, &q0, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}